

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::StoppedEvent>::destruct(BasicTypeInfo<dap::StoppedEvent> *this,void *ptr)

{
  void *pvVar1;
  
  if (*(long **)((long)ptr + 0x78) != (long *)((long)ptr + 0x88)) {
    operator_delete(*(long **)((long)ptr + 0x78),*(long *)((long)ptr + 0x88) + 1);
  }
  if (*(long **)((long)ptr + 0x58) != (long *)((long)ptr + 0x68)) {
    operator_delete(*(long **)((long)ptr + 0x58),*(long *)((long)ptr + 0x68) + 1);
  }
  pvVar1 = *(void **)((long)ptr + 0x30);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)((long)ptr + 0x40) - (long)pvVar1);
  }
  if (*(long **)((long)ptr + 8) != (long *)((long)ptr + 0x18)) {
    operator_delete(*(long **)((long)ptr + 8),*(long *)((long)ptr + 0x18) + 1);
    return;
  }
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }